

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

MTBDD mtbdd_fraction(int64_t nom,uint64_t denom)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  MTBDD MVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint64_t value;
  uint uVar8;
  ulong uVar9;
  
  if (nom == 0) {
    value = 1;
  }
  else {
    lVar2 = -nom;
    if (0 < nom) {
      lVar2 = nom;
    }
    uVar1 = (uint)lVar2;
    uVar8 = (uint)denom;
    uVar5 = uVar8;
    if ((uVar1 != 0) && (uVar5 = uVar1, uVar8 != 0)) {
      uVar5 = 0;
      for (uVar6 = uVar1; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x80000000) {
        uVar5 = uVar5 + 1;
      }
      uVar3 = denom & 0xffffffff;
      uVar5 = uVar1 >> (uVar5 & 0x1f);
      do {
        uVar6 = 0;
        for (uVar7 = (uint)uVar3; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x80000000) {
          uVar6 = uVar6 + 1;
        }
        uVar7 = (uint)uVar3 >> (uVar6 & 0x1f);
        uVar6 = uVar7;
        if (uVar5 < uVar7) {
          uVar6 = uVar5;
        }
        uVar9 = (ulong)uVar5 - (ulong)uVar7;
        uVar3 = -uVar9;
        if (0 < (long)uVar9) {
          uVar3 = uVar9;
        }
        uVar5 = uVar6;
      } while ((int)uVar3 != 0);
      uVar5 = 0;
      for (uVar1 = uVar1 | uVar8; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x80000000) {
        uVar5 = uVar5 + 1;
      }
      uVar5 = uVar6 << (uVar5 & 0x1f);
    }
    lVar2 = nom / (long)(ulong)uVar5;
    uVar3 = denom / uVar5;
    if ((lVar2 - 0x80000000U < 0xffffffff00000001) || (uVar3 >> 0x20 != 0)) {
      mtbdd_fraction_cold_1();
    }
    value = lVar2 << 0x20 | uVar3;
  }
  MVar4 = mtbdd_makeleaf(2,value);
  return MVar4;
}

Assistant:

MTBDD
mtbdd_fraction(int64_t nom, uint64_t denom)
{
    if (nom == 0) return mtbdd_makeleaf(2, 1);
    uint32_t c = gcd(nom < 0 ? -nom : nom, denom);
    nom /= c;
    denom /= c;
    if (nom > 2147483647 || nom < -2147483647 || denom > 4294967295) fprintf(stderr, "mtbdd_fraction: fraction overflow\n");
    return mtbdd_makeleaf(2, (nom<<32)|denom);
}